

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinerama.c
# Opt level: O3

natwm_error xinerama_get_screens(natwm_state *state,xcb_rectangle_t **destination,size_t *count)

{
  undefined4 uVar1;
  uint uVar2;
  void *__ptr;
  long lVar3;
  xcb_rectangle_t *pxVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  long local_38;
  xcb_generic_error_t *err;
  
  local_38 = 0;
  uVar1 = xcb_xinerama_query_screens(state->xcb);
  __ptr = (void *)xcb_xinerama_query_screens_reply(state->xcb,uVar1,&local_38);
  if (local_38 == 0) {
    lVar3 = xcb_xinerama_query_screens_screen_info(__ptr);
    if (lVar3 != 0) {
      uVar2 = xcb_xinerama_query_screens_screen_info_length(__ptr);
      if ((int)uVar2 < 1) {
        __assert_fail("screen_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/xinerama.c"
                      ,0x3e,
                      "enum natwm_error xinerama_get_screens(const struct natwm_state *, xcb_rectangle_t **, size_t *)"
                     );
      }
      uVar6 = (ulong)uVar2;
      pxVar4 = (xcb_rectangle_t *)malloc(uVar6 * 8);
      if (pxVar4 != (xcb_rectangle_t *)0x0) {
        uVar5 = 0;
        do {
          pxVar4[uVar5] = *(xcb_rectangle_t *)(lVar3 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
        *destination = pxVar4;
        *count = uVar6;
        free(__ptr);
        return NO_ERROR;
      }
      return MEMORY_ALLOCATION_ERROR;
    }
    internal_logger(natwm_logger,LEVEL_INFO,"Failed to get xinerama screen info");
  }
  else {
    internal_logger(natwm_logger,LEVEL_INFO,"Failed to get xinerama screens");
    free(__ptr);
  }
  return GENERIC_ERROR;
}

Assistant:

enum natwm_error xinerama_get_screens(const struct natwm_state *state,
                                      xcb_rectangle_t **destination, size_t *count)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_xinerama_query_screens_cookie_t query_screens_cookie
                = xcb_xinerama_query_screens(state->xcb);
        xcb_xinerama_query_screens_reply_t *query_screens_reply
                = xcb_xinerama_query_screens_reply(state->xcb, query_screens_cookie, &err);

        if (err != XCB_NONE) {
                LOG_INFO(natwm_logger, "Failed to get xinerama screens");

                free(query_screens_reply);

                return GENERIC_ERROR;
        }

        xcb_xinerama_screen_info_t *screens_info
                = xcb_xinerama_query_screens_screen_info(query_screens_reply);

        if (screens_info == NULL) {
                LOG_INFO(natwm_logger, "Failed to get xinerama screen info");

                return GENERIC_ERROR;
        }

        int screen_count = xcb_xinerama_query_screens_screen_info_length(query_screens_reply);

        assert(screen_count > 0);

        xcb_rectangle_t *screen_rects = malloc(sizeof(xcb_rectangle_t) * (size_t)screen_count);

        if (screen_rects == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        for (size_t i = 0; i < (size_t)screen_count; ++i) {
                xcb_xinerama_screen_info_t screen_info = screens_info[i];
                xcb_rectangle_t screen_rect = {
                        .x = screen_info.x_org,
                        .y = screen_info.y_org,
                        .width = screen_info.width,
                        .height = screen_info.height,
                };

                screen_rects[i] = screen_rect;
        }

        *destination = screen_rects;
        *count = (size_t)screen_count;

        free(query_screens_reply);

        return NO_ERROR;
}